

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_upload.c
# Opt level: O0

Qiniu_Error
upload_one_part(Qiniu_Client *client,Qiniu_Multipart_PutExtra *extraParam,char *path,int partNum,
               Qiniu_ReaderAt reader,Qiniu_Int64 partOffset,Qiniu_Int64 partSize,char *md5str,
               Qiniu_UploadPartResp *ret,_Qiniu_Progress_Callback_Data *progressCallback)

{
  bool bVar1;
  uint code;
  Qiniu_Retry_Decision QVar2;
  char *pcVar3;
  char *pcVar4;
  Qiniu_Error QVar5;
  Qiniu_Error QVar6;
  char *etag;
  char *md5;
  char *reqUrl;
  char *upHost;
  Qiniu_Json *callRet;
  Qiniu_Reader thisPartBody;
  Qiniu_Section section;
  _Qiniu_Progress_Callback_Data *p_Stack_70;
  int tries;
  void *callbackData;
  _func_int_void_ptr_double_double_double_double *callback;
  size_t upHostsCount;
  char **upHosts;
  int partNum_local;
  char *path_local;
  Qiniu_Multipart_PutExtra *extraParam_local;
  Qiniu_Client *client_local;
  Qiniu_ReaderAt reader_local;
  Qiniu_Error err;
  
  reader_local.ReadAt = (Qiniu_FnReadAt)Qiniu_OK._0_8_;
  err._0_8_ = Qiniu_OK.message;
  callbackData = (void *)0x0;
  p_Stack_70 = (_Qiniu_Progress_Callback_Data *)0x0;
  if ((progressCallback != (_Qiniu_Progress_Callback_Data *)0x0) &&
     (progressCallback->callback != (_func_void_size_t_size_t *)0x0)) {
    callbackData = _Qiniu_Progress_Callback;
    p_Stack_70 = progressCallback;
  }
  if (extraParam->upHost == (char *)0x0) {
    upHostsCount = (size_t)extraParam->upHosts;
    callback = (_func_int_void_ptr_double_double_double_double *)extraParam->upHostsCount;
  }
  else {
    callback = (_func_int_void_ptr_double_double_double_double *)0x1;
    upHostsCount = (size_t)extraParam;
  }
  section.limit._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (section.limit._4_4_ < extraParam->tryTimes) {
      bVar1 = (ulong)(long)section.limit._4_4_ <= client->hostsRetriesMax;
    }
    if (!bVar1) goto LAB_001191a5;
    memset(&thisPartBody.Read,0,0x20);
    _callRet = Qiniu_SectionReader((Qiniu_Section *)&thisPartBody.Read,reader,partOffset,partSize);
    upHost = (char *)0x0;
    pcVar3 = Qiniu_String_Concat(*(char **)(upHostsCount +
                                           ((ulong)(long)section.limit._4_4_ % (ulong)callback) * 8)
                                 ,path,0);
    QVar5 = Qiniu_Client_CallWithMethodAndProgressCallback
                      (client,(Qiniu_Json **)&upHost,pcVar3,_callRet,partSize,(char *)0x0,"PUT",
                       md5str,(_func_int_void_ptr_double_double_double_double *)callbackData,
                       p_Stack_70);
    err._0_8_ = QVar5.message;
    code = QVar5.code;
    reader_local.ReadAt = (Qiniu_FnReadAt)(ulong)code;
    Qiniu_Free(pcVar3);
    if (code == 200) break;
    QVar2 = _Qiniu_Should_Retry(code);
    if (QVar2 == QINIU_DONT_RETRY) goto LAB_001191a5;
    section.limit._4_4_ = section.limit._4_4_ + 1;
  }
  if (ret != (Qiniu_UploadPartResp *)0x0) {
    pcVar3 = Qiniu_Json_GetString((Qiniu_Json *)upHost,"md5",(char *)0x0);
    pcVar4 = Qiniu_Json_GetString((Qiniu_Json *)upHost,"etag",(char *)0x0);
    pcVar4 = Qiniu_String_Dup(pcVar4);
    ret->etag = pcVar4;
    pcVar3 = Qiniu_String_Dup(pcVar3);
    ret->md5 = pcVar3;
    ret->partNum = partNum;
  }
LAB_001191a5:
  if (((int)reader_local.ReadAt == 200) && (extraParam->notify != (NotifyFunc)0x0)) {
    (*extraParam->notify)(ret);
  }
  else if (((int)reader_local.ReadAt != 200) && (extraParam->notifyErr != (NotifyErrFunc)0x0)) {
    QVar5._0_8_ = (ulong)reader_local.ReadAt & 0xffffffff;
    QVar5.message = (char *)err._0_8_;
    (*extraParam->notifyErr)(partNum,QVar5);
  }
  QVar6._0_8_ = (ulong)reader_local.ReadAt & 0xffffffff;
  QVar6.message = (char *)err._0_8_;
  return QVar6;
}

Assistant:

Qiniu_Error upload_one_part(Qiniu_Client *client, Qiniu_Multipart_PutExtra *extraParam, const char *path,
                            int partNum, Qiniu_ReaderAt reader, Qiniu_Int64 partOffset, Qiniu_Int64 partSize, const char *md5str,
                            Qiniu_UploadPartResp *ret, struct _Qiniu_Progress_Callback_Data *progressCallback)
{
    Qiniu_Error err = Qiniu_OK;
    const char *const *upHosts;
    size_t upHostsCount;
    int (*callback)(void *, double, double, double, double) = NULL;
    void *callbackData = NULL;
    if (progressCallback != NULL && progressCallback->callback != NULL)
    {
        callback = _Qiniu_Progress_Callback;
        callbackData = (void *)progressCallback;
    }

    if (extraParam->upHost != NULL)
    {
        upHosts = &extraParam->upHost;
        upHostsCount = 1;
    }
    else
    {
        upHosts = extraParam->upHosts;
        upHostsCount = extraParam->upHostsCount;
    }
    for (int tries = 0; tries < extraParam->tryTimes && tries <= client->hostsRetriesMax; tries++)
    {
        Qiniu_Section section;
        Qiniu_Zero(section);
        Qiniu_Reader thisPartBody = Qiniu_SectionReader(&section, reader, (Qiniu_Off_T)partOffset, partSize);
        Qiniu_Json *callRet = NULL; // don't cJSON_Delete(callRet), it will be automatically freed on next http request by Qiniu_Client_Call.
        const char *upHost = upHosts[tries % upHostsCount];
        const char *reqUrl = Qiniu_String_Concat(upHost, path, NULL);
        err = Qiniu_Client_CallWithMethodAndProgressCallback(client, &callRet, reqUrl, thisPartBody, partSize, NULL, "PUT", md5str, callback, callbackData);
        Qiniu_Free((void *)reqUrl);
        if (err.code == 200)
        {
            if (ret != NULL)
            {
                const char *md5 = Qiniu_Json_GetString(callRet, "md5", NULL);
                const char *etag = Qiniu_Json_GetString(callRet, "etag", NULL);
                ret->etag = Qiniu_String_Dup(etag);
                ret->md5 = Qiniu_String_Dup(md5);
                ret->partNum = partNum;
            }
            break;
        }
        else if (_Qiniu_Should_Retry(err.code) == QINIU_DONT_RETRY)
        {
            break;
        }
    }
    // notify callback
    if (err.code == 200 && extraParam->notify)
    {
        extraParam->notify(ret);
    }
    else if (err.code != 200 && extraParam->notifyErr)
    {
        extraParam->notifyErr(partNum, err);
    }

    return err;
}